

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tlsio_openssl.c
# Opt level: O0

void on_underlying_io_error(void *context)

{
  TLS_IO_INSTANCE *tls_io_instance;
  void *context_local;
  
  if (*(int *)((long)context + 0x68) - 1U < 2) {
    *(undefined4 *)((long)context + 0x68) = 0;
    indicate_open_complete((TLS_IO_INSTANCE *)context,IO_OPEN_ERROR);
  }
  else if (*(int *)((long)context + 0x68) == 4) {
    indicate_error((TLS_IO_INSTANCE *)context);
  }
  return;
}

Assistant:

static void on_underlying_io_error(void* context)
{
    TLS_IO_INSTANCE* tls_io_instance = (TLS_IO_INSTANCE*)context;

    switch (tls_io_instance->tlsio_state)
    {
    default:
        break;

    case TLSIO_STATE_OPENING_UNDERLYING_IO:
    case TLSIO_STATE_IN_HANDSHAKE:
        tls_io_instance->tlsio_state = TLSIO_STATE_NOT_OPEN;
        indicate_open_complete(tls_io_instance, IO_OPEN_ERROR);
        break;

    case TLSIO_STATE_OPEN:
        indicate_error(tls_io_instance);
        break;
    }
}